

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeSplit(ConvertLayerParameters layerParameters)

{
  long *plVar1;
  Rep *pRVar2;
  Type *pTVar3;
  LogMessage *other;
  mapped_type *pmVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  long in_stack_00000008;
  string input;
  int *in_stack_00000048;
  LogFinisher local_89;
  long *local_88 [2];
  long local_78 [2];
  undefined1 local_68 [56];
  
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  if ((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Must have 1 input","");
    errorInCaffeProto((string *)local_68,(pTVar3->name_).ptr_,(pTVar3->type_).ptr_);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if ((pTVar3->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_89,other);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
  }
  plVar1 = (long *)((pTVar3->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  lVar7 = *plVar1;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,lVar7,plVar1[1] + lVar7);
  pRVar2 = (pTVar3->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  lVar7 = (long)(pTVar3->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar7 != 0) {
    lVar5 = 0;
    do {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)input.field_2._8_8_,*(key_type **)((long)ppvVar6 + lVar5));
      std::__cxx11::string::_M_assign((string *)pmVar4);
      lVar5 = lVar5 + 8;
    } while (lVar7 * 8 != lVar5);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeSplit(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    /*
     Split: Split layer in caffe is basically a Renaming layer:  needs special operation: add names to the hash
     */
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    if (caffeLayer.bottom_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input",caffeLayer.name(),caffeLayer.type());
    }
    
    std::string input = caffeLayer.bottom(0);
    for (const auto& output: caffeLayer.top()){
        mappingDataBlobNames[output] = input;
    }
}